

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BasicBlock * __thiscall
FlowGraph::AddBlock(FlowGraph *this,Instr *firstInstr,Instr *lastInstr,BasicBlock *nextBlock,
                   BasicBlock *prevBlock)

{
  uint num;
  anon_class_24_3_b6880963 fn;
  IRKind IVar1;
  bool bVar2;
  BOOL BVar3;
  MultiBranchInstr *this_00;
  FlowGraph *this_01;
  LabelInstr *pLVar4;
  BasicBlock *this_02;
  bool local_b9;
  bool local_a1;
  BranchInstr *instr;
  Instr *instrNext;
  LabelInstr *targetLabelInstr;
  MultiBranchInstr *multiBranchInstr;
  BasicBlock *blockMultiBrTarget;
  BranchInstr *branchInstr;
  BasicBlock *blockTarget;
  LabelInstr *labelInstr;
  BasicBlock *block;
  BasicBlock *prevBlock_local;
  BasicBlock *nextBlock_local;
  Instr *lastInstr_local;
  Instr *firstInstr_local;
  FlowGraph *this_local;
  Instr *local_10;
  
  block = prevBlock;
  prevBlock_local = nextBlock;
  nextBlock_local = (BasicBlock *)lastInstr;
  lastInstr_local = firstInstr;
  firstInstr_local = (Instr *)this;
  local_10 = firstInstr;
  IVar1 = IR::Instr::GetKind(firstInstr);
  local_a1 = true;
  if (IVar1 != InstrKindLabel) {
    local_a1 = IR::Instr::IsProfiledLabelInstr(firstInstr);
  }
  if (local_a1 == false) {
    blockTarget = (BasicBlock *)IR::LabelInstr::New(Label,lastInstr_local->m_func,false);
    IR::Instr::SetByteCodeOffset((Instr *)blockTarget,lastInstr_local);
    bVar2 = IR::Instr::IsEntryInstr(lastInstr_local);
    if (bVar2) {
      IR::Instr::InsertAfter(lastInstr_local,(Instr *)blockTarget);
    }
    else {
      IR::Instr::InsertBefore(lastInstr_local,(Instr *)blockTarget);
    }
    lastInstr_local = (Instr *)blockTarget;
  }
  else {
    blockTarget = (BasicBlock *)IR::Instr::AsLabelInstr(lastInstr_local);
  }
  labelInstr = (LabelInstr *)IR::LabelInstr::GetBasicBlock((LabelInstr *)blockTarget);
  if ((BasicBlock *)labelInstr == (BasicBlock *)0x0) {
    labelInstr = (LabelInstr *)BasicBlock::New(this);
    IR::LabelInstr::SetBasicBlock((LabelInstr *)blockTarget,(BasicBlock *)labelInstr);
    if (this->tailBlock == (BasicBlock *)0x0) {
      this->tailBlock = (BasicBlock *)labelInstr;
    }
  }
  bVar2 = IR::Instr::EndsBasicBlock((Instr *)nextBlock_local);
  if (bVar2) {
    branchInstr = (BranchInstr *)0x0;
    bVar2 = IR::Instr::IsBranchInstr((Instr *)nextBlock_local);
    if (bVar2) {
      blockMultiBrTarget = (BasicBlock *)IR::Instr::AsBranchInstr((Instr *)nextBlock_local);
      bVar2 = IR::BranchInstr::IsMultiBranch((BranchInstr *)blockMultiBrTarget);
      if (bVar2) {
        this_00 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)blockMultiBrTarget);
        fn.this = this;
        fn.blockMultiBrTarget = (BasicBlock **)&multiBranchInstr;
        fn.block = (BasicBlock **)&labelInstr;
        IR::MultiBranchInstr::
        MapUniqueMultiBrLabels<FlowGraph::AddBlock(IR::Instr*,IR::Instr*,BasicBlock*,BasicBlock*)::__0>
                  (this_00,fn);
      }
      else {
        pLVar4 = IR::BranchInstr::GetTarget((BranchInstr *)blockMultiBrTarget);
        branchInstr = (BranchInstr *)SetBlockTargetAndLoopFlag(this,pLVar4);
        bVar2 = IR::BranchInstr::IsConditional((BranchInstr *)blockMultiBrTarget);
        if (bVar2) {
          this_01 = (FlowGraph *)IR::Instr::GetNextRealInstrOrLabel((Instr *)blockMultiBrTarget);
          this_local = this_01;
          IVar1 = IR::Instr::GetKind((Instr *)this_01);
          local_b9 = true;
          if (IVar1 != InstrKindLabel) {
            local_b9 = IR::Instr::IsProfiledLabelInstr((Instr *)this_01);
          }
          if (local_b9 != false) {
            pLVar4 = IR::Instr::AsLabelInstr((Instr *)this_01);
            SetBlockTargetAndLoopFlag(this,pLVar4);
          }
        }
      }
    }
    else if ((*(short *)&nextBlock_local->upwardExposedFields == 0x24) &&
            ((BasicBlock *)labelInstr != this->tailBlock)) {
      branchInstr = (BranchInstr *)this->tailBlock;
    }
    if (branchInstr != (BranchInstr *)0x0) {
      AddEdge(this,(BasicBlock *)labelInstr,(BasicBlock *)branchInstr);
    }
  }
  bVar2 = IR::Instr::HasFallThrough((Instr *)nextBlock_local);
  if (bVar2) {
    BVar3 = Func::HasTry(this->func);
    if ((BVar3 == 0) && (bVar2 = IR::Instr::IsBranchInstr((Instr *)nextBlock_local), !bVar2)) {
      pLVar4 = IR::Instr::AsLabelInstr((Instr *)nextBlock_local->loop);
      this_02 = (BasicBlock *)
                IR::BranchInstr::New(Br,pLVar4,(Func *)nextBlock_local->liveFixedFields);
      IR::Instr::SetByteCodeOffset((Instr *)this_02,(Instr *)nextBlock_local->loop);
      IR::Instr::InsertAfter((Instr *)nextBlock_local,(Instr *)this_02);
      nextBlock_local = this_02;
    }
    AddEdge(this,(BasicBlock *)labelInstr,prevBlock_local);
  }
  num = this->blockCount;
  this->blockCount = num + 1;
  BasicBlock::SetBlockNum((BasicBlock *)labelInstr,num);
  BasicBlock::SetFirstInstr((BasicBlock *)labelInstr,lastInstr_local);
  BasicBlock::SetLastInstr((BasicBlock *)labelInstr,(Instr *)nextBlock_local);
  if (block == (BasicBlock *)0x0) {
    if (this->blockList != (BasicBlock *)0x0) {
      this->blockList->prev = (BasicBlock *)labelInstr;
    }
    (labelInstr->super_Instr)._vptr_Instr = (_func_int **)this->blockList;
    this->blockList = (BasicBlock *)labelInstr;
  }
  else {
    block->next = (BasicBlock *)labelInstr;
    *(BasicBlock **)&(labelInstr->super_Instr).m_noLazyHelperAssert = block;
    (labelInstr->super_Instr)._vptr_Instr = (_func_int **)prevBlock_local;
    prevBlock_local->prev = (BasicBlock *)labelInstr;
  }
  return (BasicBlock *)labelInstr;
}

Assistant:

BasicBlock *
FlowGraph::AddBlock(
    IR::Instr * firstInstr,
    IR::Instr * lastInstr,
    BasicBlock * nextBlock,
    BasicBlock *prevBlock)
{
    BasicBlock * block;
    IR::LabelInstr * labelInstr;

    if (firstInstr->IsLabelInstr())
    {
        labelInstr = firstInstr->AsLabelInstr();
    }
    else
    {
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, firstInstr->m_func);
        labelInstr->SetByteCodeOffset(firstInstr);
        if (firstInstr->IsEntryInstr())
        {
            firstInstr->InsertAfter(labelInstr);
        }
        else
        {
            firstInstr->InsertBefore(labelInstr);
        }
        firstInstr = labelInstr;
    }

    block = labelInstr->GetBasicBlock();
    if (block == nullptr)
    {
        block = BasicBlock::New(this);
        labelInstr->SetBasicBlock(block);
        // Remember last block in function to target successor of RETs.
        if (!this->tailBlock)
        {
            this->tailBlock = block;
        }
    }

    // Hook up the successor edges
    if (lastInstr->EndsBasicBlock())
    {
        BasicBlock * blockTarget = nullptr;

        if (lastInstr->IsBranchInstr())
        {
            // Hook up a successor edge to the branch target.
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();

            if(branchInstr->IsMultiBranch())
            {
                BasicBlock * blockMultiBrTarget;

                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                multiBranchInstr->MapUniqueMultiBrLabels([&](IR::LabelInstr * labelInstr) -> void
                {
                    blockMultiBrTarget = SetBlockTargetAndLoopFlag(labelInstr);
                    this->AddEdge(block, blockMultiBrTarget);
                });
            }
            else
            {
                IR::LabelInstr * targetLabelInstr = branchInstr->GetTarget();
                blockTarget = SetBlockTargetAndLoopFlag(targetLabelInstr);
                if (branchInstr->IsConditional())
                {
                    IR::Instr *instrNext = branchInstr->GetNextRealInstrOrLabel();

                    if (instrNext->IsLabelInstr())
                    {
                        SetBlockTargetAndLoopFlag(instrNext->AsLabelInstr());
                    }
                }
            }
        }
        else if (lastInstr->m_opcode == Js::OpCode::Ret && block != this->tailBlock)
        {
            blockTarget = this->tailBlock;
        }

        if (blockTarget)
        {
            this->AddEdge(block, blockTarget);
        }
    }

    if (lastInstr->HasFallThrough())
    {
        // Add a branch to next instruction so that we don't have to update the flow graph
        // when the glob opt tries to insert instructions.
        // We don't run the globopt with try/catch, don't need to insert branch to next for fall through blocks.
        if (!this->func->HasTry() && !lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * instr = IR::BranchInstr::New(Js::OpCode::Br,
                lastInstr->m_next->AsLabelInstr(), lastInstr->m_func);
            instr->SetByteCodeOffset(lastInstr->m_next);
            lastInstr->InsertAfter(instr);
            lastInstr = instr;
        }
        this->AddEdge(block, nextBlock);
    }

    block->SetBlockNum(this->blockCount++);
    block->SetFirstInstr(firstInstr);
    block->SetLastInstr(lastInstr);

    if (!prevBlock)
    {
        if (this->blockList)
        {
            this->blockList->prev = block;
        }
        block->next = this->blockList;
        this->blockList = block;
    }
    else
    {
        prevBlock->next = block;
        block->prev = prevBlock;
        block->next = nextBlock;
        nextBlock->prev = block;
    }
    return block;
}